

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBScene.h
# Opt level: O0

void __thiscall Assimp::COB::Node::~Node(Node *this)

{
  Node *this_local;
  
  ~Node(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

virtual ~Node() {}